

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_PackedExtensions_Test::
~GeneratedMessageReflectionTest_PackedExtensions_Test
          (GeneratedMessageReflectionTest_PackedExtensions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, PackedExtensions) {
  // Set every extension to a unique value then go back and check all those
  // values.
  unittest::TestPackedExtensions message;

  // First set the extensions via the generated API (see b/366468123).
  TestUtil::SetPackedExtensions(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  message.Clear();

  TestUtil::ReflectionTester reflection_tester(
      unittest::TestPackedExtensions::descriptor());

  reflection_tester.SetPackedFieldsViaReflection(&message);
  TestUtil::ExpectPackedExtensionsSet(message);
  reflection_tester.ExpectPackedFieldsSetViaReflection(message);
}